

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall
ImGuiSimpleColumns::Update(ImGuiSimpleColumns *this,int count,float spacing,bool clear)

{
  int local_20;
  int i;
  bool clear_local;
  float spacing_local;
  int count_local;
  ImGuiSimpleColumns *this_local;
  
  if (this->Count < 9) {
    this->Count = count;
    this->NextWidth = 0.0;
    this->Width = 0.0;
    this->Spacing = spacing;
    if (clear) {
      memset(this->NextWidths,0,0x20);
    }
    for (local_20 = 0; local_20 < this->Count; local_20 = local_20 + 1) {
      if ((0 < local_20) && (0.0 < this->NextWidths[local_20])) {
        this->Width = this->Spacing + this->Width;
      }
      this->Pos[local_20] = (float)(int)this->Width;
      this->Width = this->NextWidths[local_20] + this->Width;
      this->NextWidths[local_20] = 0.0;
    }
    return;
  }
  __assert_fail("Count <= ((int)(sizeof(Pos)/sizeof(*Pos)))",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                ,0x63e,"void ImGuiSimpleColumns::Update(int, float, bool)");
}

Assistant:

void ImGuiSimpleColumns::Update(int count, float spacing, bool clear)
{
    IM_ASSERT(Count <= IM_ARRAYSIZE(Pos));
    Count = count;
    Width = NextWidth = 0.0f;
    Spacing = spacing;
    if (clear) memset(NextWidths, 0, sizeof(NextWidths));
    for (int i = 0; i < Count; i++)
    {
        if (i > 0 && NextWidths[i] > 0.0f)
            Width += Spacing;
        Pos[i] = (float)(int)Width;
        Width += NextWidths[i];
        NextWidths[i] = 0.0f;
    }
}